

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

double __thiscall
gmlc::utilities::numeric_conversion<double>(utilities *this,string_view V,double defValue)

{
  string_view V_00;
  double local_8;
  
  V_00._M_str = (byte *)V._M_len;
  local_8 = defValue;
  if ((this != (utilities *)0x0) && (numCheck[*V_00._M_str] == '\x01')) {
    V_00._M_len = (size_t)this;
    local_8 = numConv<double>(V_00);
  }
  return local_8;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}